

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O2

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CLogExp *exp)

{
  undefined1 auStack_38 [40];
  
  std::operator<<((ostream *)&std::cout,"typechecker: clogexp\n");
  TypeInfo::TypeInfo((TypeInfo *)auStack_38,BOOLEAN);
  TypeInfo::operator=(&this->lastCalculatedType,(TypeInfo *)auStack_38);
  std::__cxx11::string::~string((string *)(auStack_38 + 8));
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CLogExp &exp ) 
{
    std::cout << "typechecker: clogexp\n";
    lastCalculatedType = enums::TPrimitiveType::BOOLEAN;
}